

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void * ZSTD_cwksp_reserve_object(ZSTD_cwksp *ws,size_t bytes)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = ws->objectEnd;
  if (((ulong)pvVar1 & 7) != 0) {
    __assert_fail("(size_t)alloc % ZSTD_ALIGNOF(void*) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x429d,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
  }
  if ((bytes & 7) == 0) {
    ZSTD_cwksp_assert_internal_consistency(ws);
    if ((ws->phase == ZSTD_cwksp_alloc_objects) &&
       (pvVar2 = (void *)((bytes + 7 & 0xfffffffffffffff8) + (long)pvVar1),
       pvVar2 <= ws->workspaceEnd)) {
      ws->objectEnd = pvVar2;
      ws->tableEnd = pvVar2;
      ws->tableValidEnd = pvVar2;
    }
    else {
      ws->allocFailed = '\x01';
      pvVar1 = (void *)0x0;
    }
    return pvVar1;
  }
  __assert_fail("bytes % ZSTD_ALIGNOF(void*) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x429e,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_object(ZSTD_cwksp* ws, size_t bytes)
{
    size_t const roundedBytes = ZSTD_cwksp_align(bytes, sizeof(void*));
    void* alloc = ws->objectEnd;
    void* end = (BYTE*)alloc + roundedBytes;

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* over-reserve space */
    end = (BYTE *)end + 2 * ZSTD_CWKSP_ASAN_REDZONE_SIZE;
#endif

    DEBUGLOG(4,
        "cwksp: reserving %p object %zd bytes (rounded to %zd), %zd bytes remaining",
        alloc, bytes, roundedBytes, ZSTD_cwksp_available_space(ws) - roundedBytes);
    assert((size_t)alloc % ZSTD_ALIGNOF(void*) == 0);
    assert(bytes % ZSTD_ALIGNOF(void*) == 0);
    ZSTD_cwksp_assert_internal_consistency(ws);
    /* we must be in the first phase, no advance is possible */
    if (ws->phase != ZSTD_cwksp_alloc_objects || end > ws->workspaceEnd) {
        DEBUGLOG(3, "cwksp: object alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    ws->objectEnd = end;
    ws->tableEnd = end;
    ws->tableValidEnd = end;

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* Move alloc so there's ZSTD_CWKSP_ASAN_REDZONE_SIZE unused space on
     * either size. */
    alloc = (BYTE*)alloc + ZSTD_CWKSP_ASAN_REDZONE_SIZE;
    if (ws->isStatic == ZSTD_cwksp_dynamic_alloc) {
        __asan_unpoison_memory_region(alloc, bytes);
    }
#endif

    return alloc;
}